

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

int close(int __fd)

{
  rpchook_t *__ptr;
  bool bVar1;
  int iVar2;
  
  if (g_sys_close_func == (close_pfn_t)0x0) {
    g_sys_close_func = (close_pfn_t)dlsym(0xffffffffffffffff,"close");
  }
  bVar1 = co_is_enable_sys_hook();
  if ((uint)__fd < 1000000 && bVar1) {
    __ptr = g_rpchook_socket_fd[(uint)__fd];
    if (__ptr != (rpchook_t *)0x0) {
      g_rpchook_socket_fd[(uint)__fd] = (rpchook_t *)0x0;
      free(__ptr);
    }
  }
  iVar2 = (*g_sys_close_func)(__fd);
  return iVar2;
}

Assistant:

int close(int fd)
{
	HOOK_SYS_FUNC( close );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_close_func( fd );
	}

	free_by_fd( fd );
	int ret = g_sys_close_func(fd);

	return ret;
}